

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  int iVar1;
  char *pcVar2;
  VList *pVVar3;
  int in_EDX;
  Expr *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  int bOk;
  i64 *unaff_retaddr;
  int doAdd;
  ynVar x;
  char *z;
  sqlite3 *db;
  i64 i;
  short local_3a;
  sqlite3 *zName;
  undefined4 in_stack_ffffffffffffffd8;
  VList *in_stack_fffffffffffffff0;
  sqlite3 *db_00;
  
  db_00 = *(sqlite3 **)(in_FS_OFFSET + 0x28);
  zName = in_RDI->db;
  if (in_RSI != (Expr *)0x0) {
    pcVar2 = (in_RSI->u).zToken;
    if (pcVar2[1] == '\0') {
      local_3a = in_RDI->nVar + 1;
      in_RDI->nVar = local_3a;
    }
    else {
      if (*pcVar2 == '?') {
        in_stack_fffffffffffffff0 = (VList *)&DAT_aaaaaaaaaaaaaaaa;
        if (in_EDX == 2) {
          in_stack_fffffffffffffff0 = (VList *)(long)(pcVar2[1] + -0x30);
          bVar4 = true;
        }
        else {
          iVar1 = sqlite3Atoi64(_doAdd,unaff_retaddr,(int)((ulong)db_00 >> 0x20),
                                (u8)((ulong)db_00 >> 0x18));
          bVar4 = iVar1 == 0;
        }
        if (((!bVar4) || ((long)in_stack_fffffffffffffff0 < 1)) ||
           ((long)zName->aLimit[9] < (long)in_stack_fffffffffffffff0)) {
          sqlite3ErrorMsg(in_RDI,"variable number must be between ?1 and ?%d",
                          (ulong)(uint)zName->aLimit[9]);
          sqlite3RecordErrorOffsetOfExpr(in_RDI->db,in_RSI);
          goto LAB_001bd362;
        }
        local_3a = (short)in_stack_fffffffffffffff0;
        if (in_RDI->nVar < local_3a) {
          in_RDI->nVar = local_3a;
          bVar4 = true;
        }
        else {
          pcVar2 = sqlite3VListNumToName(in_RDI->pVList,(int)local_3a);
          bVar4 = pcVar2 == (char *)0x0;
        }
      }
      else {
        iVar1 = sqlite3VListNameToNum
                          ((VList *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),(char *)zName,
                           (int)((ulong)pcVar2 >> 0x20));
        local_3a = (short)iVar1;
        bVar4 = local_3a == 0;
        if (bVar4) {
          local_3a = in_RDI->nVar + 1;
          in_RDI->nVar = local_3a;
        }
      }
      if (bVar4) {
        pVVar3 = sqlite3VListAdd(db_00,in_stack_fffffffffffffff0,(char *)in_RDI,
                                 (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
        in_RDI->pVList = pVVar3;
      }
    }
    in_RSI->iColumn = local_3a;
    if (zName->aLimit[9] < (int)local_3a) {
      sqlite3ErrorMsg(in_RDI,"too many SQL variables");
      sqlite3RecordErrorOffsetOfExpr(in_RDI->db,in_RSI);
    }
  }
LAB_001bd362:
  if (*(sqlite3 **)(in_FS_OFFSET + 0x28) != db_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        sqlite3RecordErrorOffsetOfExpr(pParse->db, pExpr);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
    sqlite3RecordErrorOffsetOfExpr(pParse->db, pExpr);
  }
}